

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsimd.c
# Opt level: O2

void jsimd_h2v2_fancy_upsample
               (j_decompress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
               JSAMPARRAY *output_data_ptr)

{
  undefined1 auVar1 [16];
  uint uVar2;
  bool bVar3;
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [16];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  unkuint9 Var44;
  undefined1 auVar45 [11];
  undefined1 auVar46 [13];
  undefined1 auVar47 [15];
  unkuint9 Var48;
  undefined1 auVar49 [11];
  undefined1 auVar50 [15];
  unkuint9 Var51;
  undefined1 auVar52 [11];
  undefined1 auVar53 [13];
  undefined1 auVar54 [15];
  undefined1 auVar55 [11];
  undefined1 auVar56 [13];
  undefined1 auVar57 [15];
  undefined1 auVar58 [11];
  undefined1 auVar59 [15];
  undefined1 auVar60 [11];
  undefined1 auVar61 [13];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  ulong uVar76;
  ulong uVar77;
  undefined1 (*pauVar78) [16];
  undefined1 (*pauVar79) [16];
  undefined1 (*pauVar80) [16];
  ulong uVar81;
  undefined1 (*pauVar82) [16];
  JSAMPARRAY ppJVar83;
  undefined1 (*pauVar84) [16];
  short sVar85;
  short sVar91;
  short sVar92;
  short sVar93;
  short sVar94;
  short sVar95;
  short sVar96;
  short sVar97;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar98 [14];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [14];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  short sVar108;
  short sVar110;
  short sVar111;
  short sVar112;
  ulong uVar109;
  short sVar113;
  short sVar114;
  short sVar115;
  short sVar116;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auStack_50 [16];
  undefined1 auStack_40 [16];
  ulong uStack_28;
  ulong uStack_18;
  
  uVar2 = compptr->downsampled_width;
  uVar81 = (ulong)uVar2;
  if (((byte)simd_support & 0x80) != 0) {
    jsimd_h2v2_fancy_upsample_avx2();
    return;
  }
  if ((uVar81 != 0) && ((ulong)(uint)cinfo->max_v_samp_factor != 0)) {
    ppJVar83 = *output_data_ptr;
    uVar77 = (ulong)(uint)cinfo->max_v_samp_factor;
    do {
      pauVar78 = (undefined1 (*) [16])input_data[-1];
      pauVar80 = (undefined1 (*) [16])*input_data;
      pauVar82 = (undefined1 (*) [16])input_data[1];
      pauVar79 = (undefined1 (*) [16])*ppJVar83;
      pauVar84 = (undefined1 (*) [16])ppJVar83[1];
      if ((uVar2 & 0xf) != 0) {
        (*pauVar78)[uVar81] = pauVar78[-1][uVar81 + 0xf];
        (*pauVar80)[uVar81] = pauVar80[-1][uVar81 + 0xf];
        (*pauVar82)[uVar81] = pauVar82[-1][uVar81 + 0xf];
      }
      auVar88 = *pauVar80;
      auVar1 = *pauVar78;
      auVar86 = *pauVar82;
      auVar9[0xd] = 0;
      auVar9._0_13_ = auVar88._0_13_;
      auVar9[0xe] = auVar88[7];
      auVar15[0xc] = auVar88[6];
      auVar15._0_12_ = auVar88._0_12_;
      auVar15._13_2_ = auVar9._13_2_;
      auVar21[0xb] = 0;
      auVar21._0_11_ = auVar88._0_11_;
      auVar21._12_3_ = auVar15._12_3_;
      auVar27[10] = auVar88[5];
      auVar27._0_10_ = auVar88._0_10_;
      auVar27._11_4_ = auVar21._11_4_;
      auVar33[9] = 0;
      auVar33._0_9_ = auVar88._0_9_;
      auVar33._10_5_ = auVar27._10_5_;
      auVar39[8] = auVar88[4];
      auVar39._0_8_ = auVar88._0_8_;
      auVar39._9_6_ = auVar33._9_6_;
      auVar43._7_8_ = 0;
      auVar43._0_7_ = auVar39._8_7_;
      Var44 = CONCAT81(SUB158(auVar43 << 0x40,7),auVar88[3]);
      auVar64._9_6_ = 0;
      auVar64._0_9_ = Var44;
      auVar45._1_10_ = SUB1510(auVar64 << 0x30,5);
      auVar45[0] = auVar88[2];
      auVar65._11_4_ = 0;
      auVar65._0_11_ = auVar45;
      auVar46._1_12_ = SUB1512(auVar65 << 0x20,3);
      auVar46[0] = auVar88[1];
      auVar4[0xd] = 0;
      auVar4._0_13_ = auVar1._0_13_;
      auVar4[0xe] = auVar1[7];
      auVar10[0xc] = auVar1[6];
      auVar10._0_12_ = auVar1._0_12_;
      auVar10._13_2_ = auVar4._13_2_;
      auVar16[0xb] = 0;
      auVar16._0_11_ = auVar1._0_11_;
      auVar16._12_3_ = auVar10._12_3_;
      auVar22[10] = auVar1[5];
      auVar22._0_10_ = auVar1._0_10_;
      auVar22._11_4_ = auVar16._11_4_;
      auVar28[9] = 0;
      auVar28._0_9_ = auVar1._0_9_;
      auVar28._10_5_ = auVar22._10_5_;
      auVar34[8] = auVar1[4];
      auVar34._0_8_ = auVar1._0_8_;
      auVar34._9_6_ = auVar28._9_6_;
      auVar47._7_8_ = 0;
      auVar47._0_7_ = auVar34._8_7_;
      Var48 = CONCAT81(SUB158(auVar47 << 0x40,7),auVar1[3]);
      auVar66._9_6_ = 0;
      auVar66._0_9_ = Var48;
      auVar49._1_10_ = SUB1510(auVar66 << 0x30,5);
      auVar49[0] = auVar1[2];
      auVar67._11_4_ = 0;
      auVar67._0_11_ = auVar49;
      auVar41[2] = auVar1[1];
      auVar41._0_2_ = auVar1._0_2_;
      auVar41._3_12_ = SUB1512(auVar67 << 0x20,3);
      auVar5[0xd] = 0;
      auVar5._0_13_ = auVar86._0_13_;
      auVar5[0xe] = auVar86[7];
      auVar11[0xc] = auVar86[6];
      auVar11._0_12_ = auVar86._0_12_;
      auVar11._13_2_ = auVar5._13_2_;
      auVar17[0xb] = 0;
      auVar17._0_11_ = auVar86._0_11_;
      auVar17._12_3_ = auVar11._12_3_;
      auVar23[10] = auVar86[5];
      auVar23._0_10_ = auVar86._0_10_;
      auVar23._11_4_ = auVar17._11_4_;
      auVar29[9] = 0;
      auVar29._0_9_ = auVar86._0_9_;
      auVar29._10_5_ = auVar23._10_5_;
      auVar35[8] = auVar86[4];
      auVar35._0_8_ = auVar86._0_8_;
      auVar35._9_6_ = auVar29._9_6_;
      auVar50._7_8_ = 0;
      auVar50._0_7_ = auVar35._8_7_;
      Var51 = CONCAT81(SUB158(auVar50 << 0x40,7),auVar86[3]);
      auVar68._9_6_ = 0;
      auVar68._0_9_ = Var51;
      auVar52._1_10_ = SUB1510(auVar68 << 0x30,5);
      auVar52[0] = auVar86[2];
      auVar69._11_4_ = 0;
      auVar69._0_11_ = auVar52;
      auVar53._1_12_ = SUB1512(auVar69 << 0x20,3);
      auVar53[0] = auVar86[1];
      sVar85 = (ushort)auVar88[0] * 3;
      sVar91 = auVar46._0_2_ * 3;
      sVar92 = auVar45._0_2_ * 3;
      sVar93 = (short)Var44 * 3;
      sVar94 = auVar39._8_2_ * 3;
      sVar95 = auVar27._10_2_ * 3;
      sVar96 = auVar15._12_2_ * 3;
      sVar97 = (auVar9._13_2_ >> 8) * 3;
      sVar108 = (ushort)auVar88[8] * 3;
      sVar110 = (ushort)auVar88[9] * 3;
      sVar111 = (ushort)auVar88[10] * 3;
      sVar112 = (ushort)auVar88[0xb] * 3;
      sVar113 = (ushort)auVar88[0xc] * 3;
      sVar114 = (ushort)auVar88[0xd] * 3;
      sVar115 = (ushort)auVar88[0xe] * 3;
      sVar116 = (ushort)auVar88[0xf] * 3;
      auVar120[8] = 0xff;
      auVar120._0_8_ = 0xffffffffffffffff;
      auVar120[9] = 0xff;
      auVar120[10] = 0xff;
      auVar120[0xb] = 0xff;
      auVar120[0xc] = 0xff;
      auVar120[0xd] = 0xff;
      auVar120[0xe] = 0xff;
      auVar120[0xf] = 0xff;
      auVar98._0_2_ = (auVar1._0_2_ & 0xff) + sVar85;
      auVar98._2_2_ = auVar41._2_2_ + sVar91;
      auVar98._4_2_ = auVar49._0_2_ + sVar92;
      auVar98._6_2_ = (short)Var48 + sVar93;
      auVar98._8_2_ = auVar34._8_2_ + sVar94;
      auVar98._10_2_ = auVar22._10_2_ + sVar95;
      auVar98._12_2_ = auVar10._12_2_ + sVar96;
      auVar88._14_2_ = (auVar4._13_2_ >> 8) + sVar97;
      auVar88._0_14_ = auVar98;
      auVar104._0_2_ = (ushort)auVar86[0] + sVar85;
      auVar104._2_2_ = auVar53._0_2_ + sVar91;
      auVar104._4_2_ = auVar52._0_2_ + sVar92;
      auVar104._6_2_ = (short)Var51 + sVar93;
      auVar104._8_2_ = auVar35._8_2_ + sVar94;
      auVar104._10_2_ = auVar23._10_2_ + sVar95;
      auVar104._12_2_ = auVar11._12_2_ + sVar96;
      auVar106._14_2_ = (auVar5._13_2_ >> 8) + sVar97;
      auVar106._0_14_ = auVar104;
      *pauVar79 = auVar88;
      *(ushort *)pauVar79[1] = (ushort)auVar1[8] + sVar108;
      *(ushort *)(pauVar79[1] + 2) = (ushort)auVar1[9] + sVar110;
      *(ushort *)(pauVar79[1] + 4) = (ushort)auVar1[10] + sVar111;
      *(ushort *)(pauVar79[1] + 6) = (ushort)auVar1[0xb] + sVar112;
      *(ushort *)(pauVar79[1] + 8) = (ushort)auVar1[0xc] + sVar113;
      *(ushort *)(pauVar79[1] + 10) = (ushort)auVar1[0xd] + sVar114;
      *(ushort *)(pauVar79[1] + 0xc) = (ushort)auVar1[0xe] + sVar115;
      *(ushort *)(pauVar79[1] + 0xe) = (ushort)auVar1[0xf] + sVar116;
      *pauVar84 = auVar106;
      *(ushort *)pauVar84[1] = (ushort)auVar86[8] + sVar108;
      *(ushort *)(pauVar84[1] + 2) = (ushort)auVar86[9] + sVar110;
      *(ushort *)(pauVar84[1] + 4) = (ushort)auVar86[10] + sVar111;
      *(ushort *)(pauVar84[1] + 6) = (ushort)auVar86[0xb] + sVar112;
      *(ushort *)(pauVar84[1] + 8) = (ushort)auVar86[0xc] + sVar113;
      *(ushort *)(pauVar84[1] + 10) = (ushort)auVar86[0xd] + sVar114;
      *(ushort *)(pauVar84[1] + 0xc) = (ushort)auVar86[0xe] + sVar115;
      *(ushort *)(pauVar84[1] + 0xe) = (ushort)auVar86[0xf] + sVar116;
      auStack_50._14_2_ = 0;
      auStack_50._0_14_ = auVar98;
      auStack_50 = auStack_50 & auVar120 >> 0x70;
      auStack_40._14_2_ = 0;
      auStack_40._0_14_ = auVar104;
      auStack_40 = auStack_40 & auVar120 >> 0x70;
      uVar76 = uVar81 + 0xf & 0xfffffffffffffff0;
      if (0x10 < uVar76) goto jsimd_h2v2_fancy_upsample_sse2_columnloop;
      do {
        uStack_28 = *(ulong *)(pauVar79[1] + 8) & 0xffff000000000000;
        uStack_18 = *(ulong *)(pauVar84[1] + 8) & 0xffff000000000000;
        while( true ) {
          auVar88 = *pauVar79;
          auVar1 = pauVar79[1];
          uVar109 = auVar1._0_8_;
          auVar86._8_8_ = 0;
          auVar86._0_8_ = uVar109 << 0x30;
          auVar117._0_8_ = uVar109 << 0x10;
          auVar117._8_8_ = auVar1._8_8_ << 0x10 | uVar109 >> 0x30;
          auVar86 = auVar88 >> 0x10 | auVar86 << 0x40;
          auVar117 = auVar88 >> 0x70 | auVar117;
          auVar100._0_8_ = auVar88._0_8_ << 0x10;
          auVar100._8_8_ = auVar88._8_8_ << 0x10 | auVar88._0_8_ >> 0x30;
          auVar100 = auVar100 | auStack_50;
          auVar62._8_8_ = 0;
          auVar62._0_8_ = uStack_28;
          auVar106 = auVar1 >> 0x10 | auVar62 << 0x40;
          sVar108 = auVar88._0_2_ * 3;
          sVar110 = auVar88._2_2_ * 3;
          sVar111 = auVar88._4_2_ * 3;
          sVar112 = auVar88._6_2_ * 3;
          sVar113 = auVar88._8_2_ * 3;
          sVar114 = auVar88._10_2_ * 3;
          sVar115 = auVar88._12_2_ * 3;
          sVar116 = auVar88._14_2_ * 3;
          sVar85 = auVar1._0_2_ * 3;
          sVar91 = auVar1._2_2_ * 3;
          sVar92 = auVar1._4_2_ * 3;
          sVar93 = auVar1._6_2_ * 3;
          sVar94 = auVar1._8_2_ * 3;
          sVar95 = auVar1._10_2_ * 3;
          sVar96 = auVar1._12_2_ * 3;
          sVar97 = auVar1._14_2_ * 3;
          auVar101._0_2_ = (ushort)(auVar100._0_2_ + 8 + sVar108) >> 4;
          auVar101._2_2_ = (ushort)(auVar100._2_2_ + 8 + sVar110) >> 4;
          auVar101._4_2_ = (ushort)(auVar100._4_2_ + 8 + sVar111) >> 4;
          auVar101._6_2_ = (ushort)(auVar100._6_2_ + 8 + sVar112) >> 4;
          auVar101._8_2_ = (ushort)(auVar100._8_2_ + 8 + sVar113) >> 4;
          auVar101._10_2_ = (ushort)(auVar100._10_2_ + 8 + sVar114) >> 4;
          auVar101._12_2_ = (ushort)(auVar100._12_2_ + 8 + sVar115) >> 4;
          auVar101._14_2_ = (ushort)(auVar100._14_2_ + 8 + sVar116) >> 4;
          auVar118._0_2_ = (ushort)(auVar117._0_2_ + 8 + sVar85) >> 4;
          auVar118._2_2_ = (ushort)(auVar117._2_2_ + 8 + sVar91) >> 4;
          auVar118._4_2_ = (ushort)(auVar117._4_2_ + 8 + sVar92) >> 4;
          auVar118._6_2_ = (ushort)(auVar117._6_2_ + 8 + sVar93) >> 4;
          auVar118._8_2_ = (ushort)(auVar117._8_2_ + 8 + sVar94) >> 4;
          auVar118._10_2_ = (ushort)(auVar117._10_2_ + 8 + sVar95) >> 4;
          auVar118._12_2_ = (ushort)(auVar117._12_2_ + 8 + sVar96) >> 4;
          auVar118._14_2_ = (ushort)(auVar117._14_2_ + 8 + sVar97) >> 4;
          auVar87._0_2_ = (ushort)(auVar86._0_2_ + 7 + sVar108) >> 4;
          auVar87._2_2_ = (ushort)(auVar86._2_2_ + 7 + sVar110) >> 4;
          auVar87._4_2_ = (ushort)(auVar86._4_2_ + 7 + sVar111) >> 4;
          auVar87._6_2_ = (ushort)(auVar86._6_2_ + 7 + sVar112) >> 4;
          auVar87._8_2_ = (ushort)(auVar86._8_2_ + 7 + sVar113) >> 4;
          auVar87._10_2_ = (ushort)(auVar86._10_2_ + 7 + sVar114) >> 4;
          auVar87._12_2_ = (ushort)(auVar86._12_2_ + 7 + sVar115) >> 4;
          auVar87._14_2_ = (ushort)(auVar86._14_2_ + 7 + sVar116) >> 4;
          auVar107._0_2_ = (ushort)(auVar106._0_2_ + 7 + sVar85) >> 4;
          auVar107._2_2_ = (ushort)(auVar106._2_2_ + 7 + sVar91) >> 4;
          auVar107._4_2_ = (ushort)(auVar106._4_2_ + 7 + sVar92) >> 4;
          auVar107._6_2_ = (ushort)(auVar106._6_2_ + 7 + sVar93) >> 4;
          auVar107._8_2_ = (ushort)(auVar106._8_2_ + 7 + sVar94) >> 4;
          auVar107._10_2_ = (ushort)(auVar106._10_2_ + 7 + sVar95) >> 4;
          auVar107._12_2_ = (ushort)(auVar106._12_2_ + 7 + sVar96) >> 4;
          auVar107._14_2_ = (ushort)(auVar106._14_2_ + 7 + sVar97) >> 4;
          auVar88 = psllw(auVar87,8);
          auVar86 = psllw(auVar107,8);
          *pauVar79 = auVar101 | auVar88;
          pauVar79[1] = auVar118 | auVar86;
          auVar88 = *pauVar84;
          auVar86 = pauVar84[1];
          uVar109 = auVar86._0_8_;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = uVar109 << 0x30;
          auVar89._0_8_ = uVar109 << 0x10;
          auVar89._8_8_ = auVar86._8_8_ << 0x10 | uVar109 >> 0x30;
          auVar120 = auVar88 >> 0x10 | auVar8 << 0x40;
          auVar89 = auVar88 >> 0x70 | auVar89;
          auVar102._0_8_ = auVar88._0_8_ << 0x10;
          auVar102._8_8_ = auVar88._8_8_ << 0x10 | auVar88._0_8_ >> 0x30;
          auVar102 = auVar102 | auStack_40;
          auVar63._8_8_ = 0;
          auVar63._0_8_ = uStack_18;
          auVar106 = auVar86 >> 0x10 | auVar63 << 0x40;
          sVar108 = auVar88._0_2_ * 3;
          sVar110 = auVar88._2_2_ * 3;
          sVar111 = auVar88._4_2_ * 3;
          sVar112 = auVar88._6_2_ * 3;
          sVar113 = auVar88._8_2_ * 3;
          sVar114 = auVar88._10_2_ * 3;
          sVar115 = auVar88._12_2_ * 3;
          sVar116 = auVar88._14_2_ * 3;
          sVar85 = auVar86._0_2_ * 3;
          sVar91 = auVar86._2_2_ * 3;
          sVar92 = auVar86._4_2_ * 3;
          sVar93 = auVar86._6_2_ * 3;
          sVar94 = auVar86._8_2_ * 3;
          sVar95 = auVar86._10_2_ * 3;
          sVar96 = auVar86._12_2_ * 3;
          sVar97 = auVar86._14_2_ * 3;
          auVar103._0_2_ = (ushort)(auVar102._0_2_ + 8 + sVar108) >> 4;
          auVar103._2_2_ = (ushort)(auVar102._2_2_ + 8 + sVar110) >> 4;
          auVar103._4_2_ = (ushort)(auVar102._4_2_ + 8 + sVar111) >> 4;
          auVar103._6_2_ = (ushort)(auVar102._6_2_ + 8 + sVar112) >> 4;
          auVar103._8_2_ = (ushort)(auVar102._8_2_ + 8 + sVar113) >> 4;
          auVar103._10_2_ = (ushort)(auVar102._10_2_ + 8 + sVar114) >> 4;
          auVar103._12_2_ = (ushort)(auVar102._12_2_ + 8 + sVar115) >> 4;
          auVar103._14_2_ = (ushort)(auVar102._14_2_ + 8 + sVar116) >> 4;
          auVar90._0_2_ = (ushort)(auVar89._0_2_ + 8 + sVar85) >> 4;
          auVar90._2_2_ = (ushort)(auVar89._2_2_ + 8 + sVar91) >> 4;
          auVar90._4_2_ = (ushort)(auVar89._4_2_ + 8 + sVar92) >> 4;
          auVar90._6_2_ = (ushort)(auVar89._6_2_ + 8 + sVar93) >> 4;
          auVar90._8_2_ = (ushort)(auVar89._8_2_ + 8 + sVar94) >> 4;
          auVar90._10_2_ = (ushort)(auVar89._10_2_ + 8 + sVar95) >> 4;
          auVar90._12_2_ = (ushort)(auVar89._12_2_ + 8 + sVar96) >> 4;
          auVar90._14_2_ = (ushort)(auVar89._14_2_ + 8 + sVar97) >> 4;
          auVar121._0_2_ = (ushort)(auVar120._0_2_ + 7 + sVar108) >> 4;
          auVar121._2_2_ = (ushort)(auVar120._2_2_ + 7 + sVar110) >> 4;
          auVar121._4_2_ = (ushort)(auVar120._4_2_ + 7 + sVar111) >> 4;
          auVar121._6_2_ = (ushort)(auVar120._6_2_ + 7 + sVar112) >> 4;
          auVar121._8_2_ = (ushort)(auVar120._8_2_ + 7 + sVar113) >> 4;
          auVar121._10_2_ = (ushort)(auVar120._10_2_ + 7 + sVar114) >> 4;
          auVar121._12_2_ = (ushort)(auVar120._12_2_ + 7 + sVar115) >> 4;
          auVar121._14_2_ = (ushort)(auVar120._14_2_ + 7 + sVar116) >> 4;
          auVar119._0_2_ = (ushort)(auVar106._0_2_ + 7 + sVar85) >> 4;
          auVar119._2_2_ = (ushort)(auVar106._2_2_ + 7 + sVar91) >> 4;
          auVar119._4_2_ = (ushort)(auVar106._4_2_ + 7 + sVar92) >> 4;
          auVar119._6_2_ = (ushort)(auVar106._6_2_ + 7 + sVar93) >> 4;
          auVar119._8_2_ = (ushort)(auVar106._8_2_ + 7 + sVar94) >> 4;
          auVar119._10_2_ = (ushort)(auVar106._10_2_ + 7 + sVar95) >> 4;
          auVar119._12_2_ = (ushort)(auVar106._12_2_ + 7 + sVar96) >> 4;
          auVar119._14_2_ = (ushort)(auVar106._14_2_ + 7 + sVar97) >> 4;
          auVar106 = psllw(auVar121,8);
          auVar88 = psllw(auVar119,8);
          *pauVar84 = auVar103 | auVar106;
          pauVar84[1] = auVar90 | auVar88;
          uVar76 = uVar76 - 0x10;
          pauVar78 = pauVar78 + 1;
          pauVar80 = pauVar80 + 1;
          pauVar82 = pauVar82 + 1;
          pauVar79 = pauVar79 + 2;
          pauVar84 = pauVar84 + 2;
          auStack_50 = auVar1 >> 0x70;
          auStack_40 = auVar86 >> 0x70;
          if (uVar76 < 0x11) break;
jsimd_h2v2_fancy_upsample_sse2_columnloop:
          auVar88 = pauVar80[1];
          auVar1 = pauVar78[1];
          auVar86 = pauVar82[1];
          auVar12[0xd] = 0;
          auVar12._0_13_ = auVar88._0_13_;
          auVar12[0xe] = auVar88[7];
          auVar18[0xc] = auVar88[6];
          auVar18._0_12_ = auVar88._0_12_;
          auVar18._13_2_ = auVar12._13_2_;
          auVar24[0xb] = 0;
          auVar24._0_11_ = auVar88._0_11_;
          auVar24._12_3_ = auVar18._12_3_;
          auVar30[10] = auVar88[5];
          auVar30._0_10_ = auVar88._0_10_;
          auVar30._11_4_ = auVar24._11_4_;
          auVar36[9] = 0;
          auVar36._0_9_ = auVar88._0_9_;
          auVar36._10_5_ = auVar30._10_5_;
          auVar40[8] = auVar88[4];
          auVar40._0_8_ = auVar88._0_8_;
          auVar40._9_6_ = auVar36._9_6_;
          auVar54._7_8_ = 0;
          auVar54._0_7_ = auVar40._8_7_;
          Var44 = CONCAT81(SUB158(auVar54 << 0x40,7),auVar88[3]);
          auVar70._9_6_ = 0;
          auVar70._0_9_ = Var44;
          auVar55._1_10_ = SUB1510(auVar70 << 0x30,5);
          auVar55[0] = auVar88[2];
          auVar71._11_4_ = 0;
          auVar71._0_11_ = auVar55;
          auVar56._1_12_ = SUB1512(auVar71 << 0x20,3);
          auVar56[0] = auVar88[1];
          auVar6[0xd] = 0;
          auVar6._0_13_ = auVar1._0_13_;
          auVar6[0xe] = auVar1[7];
          auVar13[0xc] = auVar1[6];
          auVar13._0_12_ = auVar1._0_12_;
          auVar13._13_2_ = auVar6._13_2_;
          auVar19[0xb] = 0;
          auVar19._0_11_ = auVar1._0_11_;
          auVar19._12_3_ = auVar13._12_3_;
          auVar25[10] = auVar1[5];
          auVar25._0_10_ = auVar1._0_10_;
          auVar25._11_4_ = auVar19._11_4_;
          auVar31[9] = 0;
          auVar31._0_9_ = auVar1._0_9_;
          auVar31._10_5_ = auVar25._10_5_;
          auVar37[8] = auVar1[4];
          auVar37._0_8_ = auVar1._0_8_;
          auVar37._9_6_ = auVar31._9_6_;
          auVar57._7_8_ = 0;
          auVar57._0_7_ = auVar37._8_7_;
          Var48 = CONCAT81(SUB158(auVar57 << 0x40,7),auVar1[3]);
          auVar72._9_6_ = 0;
          auVar72._0_9_ = Var48;
          auVar58._1_10_ = SUB1510(auVar72 << 0x30,5);
          auVar58[0] = auVar1[2];
          auVar73._11_4_ = 0;
          auVar73._0_11_ = auVar58;
          auVar42[2] = auVar1[1];
          auVar42._0_2_ = auVar1._0_2_;
          auVar42._3_12_ = SUB1512(auVar73 << 0x20,3);
          auVar7[0xd] = 0;
          auVar7._0_13_ = auVar86._0_13_;
          auVar7[0xe] = auVar86[7];
          auVar14[0xc] = auVar86[6];
          auVar14._0_12_ = auVar86._0_12_;
          auVar14._13_2_ = auVar7._13_2_;
          auVar20[0xb] = 0;
          auVar20._0_11_ = auVar86._0_11_;
          auVar20._12_3_ = auVar14._12_3_;
          auVar26[10] = auVar86[5];
          auVar26._0_10_ = auVar86._0_10_;
          auVar26._11_4_ = auVar20._11_4_;
          auVar32[9] = 0;
          auVar32._0_9_ = auVar86._0_9_;
          auVar32._10_5_ = auVar26._10_5_;
          auVar38[8] = auVar86[4];
          auVar38._0_8_ = auVar86._0_8_;
          auVar38._9_6_ = auVar32._9_6_;
          auVar59._7_8_ = 0;
          auVar59._0_7_ = auVar38._8_7_;
          Var51 = CONCAT81(SUB158(auVar59 << 0x40,7),auVar86[3]);
          auVar74._9_6_ = 0;
          auVar74._0_9_ = Var51;
          auVar60._1_10_ = SUB1510(auVar74 << 0x30,5);
          auVar60[0] = auVar86[2];
          auVar75._11_4_ = 0;
          auVar75._0_11_ = auVar60;
          auVar61._1_12_ = SUB1512(auVar75 << 0x20,3);
          auVar61[0] = auVar86[1];
          sVar85 = (ushort)auVar88[0] * 3;
          sVar91 = auVar56._0_2_ * 3;
          sVar92 = auVar55._0_2_ * 3;
          sVar93 = (short)Var44 * 3;
          sVar94 = auVar40._8_2_ * 3;
          sVar95 = auVar30._10_2_ * 3;
          sVar96 = auVar18._12_2_ * 3;
          sVar97 = (auVar12._13_2_ >> 8) * 3;
          sVar108 = (ushort)auVar88[8] * 3;
          sVar110 = (ushort)auVar88[9] * 3;
          sVar111 = (ushort)auVar88[10] * 3;
          sVar112 = (ushort)auVar88[0xb] * 3;
          sVar113 = (ushort)auVar88[0xc] * 3;
          sVar114 = (ushort)auVar88[0xd] * 3;
          sVar115 = (ushort)auVar88[0xe] * 3;
          sVar116 = (ushort)auVar88[0xf] * 3;
          auVar99._0_8_ =
               CONCAT26((short)Var48 + sVar93,
                        CONCAT24(auVar58._0_2_ + sVar92,
                                 CONCAT22(auVar42._2_2_ + sVar91,(auVar1._0_2_ & 0xff) + sVar85)));
          auVar99._8_2_ = auVar37._8_2_ + sVar94;
          auVar99._10_2_ = auVar25._10_2_ + sVar95;
          auVar99._12_2_ = auVar13._12_2_ + sVar96;
          auVar99._14_2_ = (auVar6._13_2_ >> 8) + sVar97;
          auVar105._0_8_ =
               CONCAT26((short)Var51 + sVar93,
                        CONCAT24(auVar60._0_2_ + sVar92,
                                 CONCAT22(auVar61._0_2_ + sVar91,(ushort)auVar86[0] + sVar85)));
          auVar105._8_2_ = auVar38._8_2_ + sVar94;
          auVar105._10_2_ = auVar26._10_2_ + sVar95;
          auVar105._12_2_ = auVar14._12_2_ + sVar96;
          auVar105._14_2_ = (auVar7._13_2_ >> 8) + sVar97;
          pauVar79[2] = auVar99;
          *(ushort *)pauVar79[3] = (ushort)auVar1[8] + sVar108;
          *(ushort *)(pauVar79[3] + 2) = (ushort)auVar1[9] + sVar110;
          *(ushort *)(pauVar79[3] + 4) = (ushort)auVar1[10] + sVar111;
          *(ushort *)(pauVar79[3] + 6) = (ushort)auVar1[0xb] + sVar112;
          *(ushort *)(pauVar79[3] + 8) = (ushort)auVar1[0xc] + sVar113;
          *(ushort *)(pauVar79[3] + 10) = (ushort)auVar1[0xd] + sVar114;
          *(ushort *)(pauVar79[3] + 0xc) = (ushort)auVar1[0xe] + sVar115;
          *(ushort *)(pauVar79[3] + 0xe) = (ushort)auVar1[0xf] + sVar116;
          pauVar84[2] = auVar105;
          *(ushort *)pauVar84[3] = (ushort)auVar86[8] + sVar108;
          *(ushort *)(pauVar84[3] + 2) = (ushort)auVar86[9] + sVar110;
          *(ushort *)(pauVar84[3] + 4) = (ushort)auVar86[10] + sVar111;
          *(ushort *)(pauVar84[3] + 6) = (ushort)auVar86[0xb] + sVar112;
          *(ushort *)(pauVar84[3] + 8) = (ushort)auVar86[0xc] + sVar113;
          *(ushort *)(pauVar84[3] + 10) = (ushort)auVar86[0xd] + sVar114;
          *(ushort *)(pauVar84[3] + 0xc) = (ushort)auVar86[0xe] + sVar115;
          *(ushort *)(pauVar84[3] + 0xe) = (ushort)auVar86[0xf] + sVar116;
          uStack_28 = auVar99._0_8_ << 0x30;
          uStack_18 = auVar105._0_8_ << 0x30;
        }
      } while (uVar76 != 0);
      input_data = input_data + 1;
      ppJVar83 = ppJVar83 + 2;
      uVar76 = uVar77 - 2;
      bVar3 = 1 < (long)uVar77;
      uVar77 = uVar76;
    } while (uVar76 != 0 && bVar3);
  }
  return;
}

Assistant:

GLOBAL(void)
jsimd_h2v2_fancy_upsample(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                          JSAMPARRAY input_data, JSAMPARRAY *output_data_ptr)
{
  if (simd_support & JSIMD_AVX2)
    jsimd_h2v2_fancy_upsample_avx2(cinfo->max_v_samp_factor,
                                   compptr->downsampled_width, input_data,
                                   output_data_ptr);
  else
    jsimd_h2v2_fancy_upsample_sse2(cinfo->max_v_samp_factor,
                                   compptr->downsampled_width, input_data,
                                   output_data_ptr);
}